

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O1

image_data * pcx_read(sptr_t data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint8_t uVar6;
  uint16_t uVar7;
  image_data *piVar8;
  uint8_t *puVar9;
  ulong uVar10;
  size_t size;
  bool bVar11;
  sptr_t sVar12;
  sptr_t sVar13;
  uchar *ptr;
  uchar *local_38;
  
  piVar8 = (image_data *)xmalloc(0x50);
  local_38 = data.ptr;
  puVar9 = (uint8_t *)xmalloc(0x80);
  uVar6 = read_8(&local_38);
  *puVar9 = uVar6;
  uVar6 = read_8(&local_38);
  puVar9[1] = uVar6;
  uVar6 = read_8(&local_38);
  puVar9[2] = uVar6;
  uVar6 = read_8(&local_38);
  puVar9[3] = uVar6;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 4) = uVar7;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 6) = uVar7;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 8) = uVar7;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 10) = uVar7;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 0xc) = uVar7;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 0xe) = uVar7;
  uVar1 = *(undefined8 *)(local_38 + 8);
  uVar2 = *(undefined8 *)(local_38 + 0x10);
  uVar3 = *(undefined8 *)(local_38 + 0x18);
  uVar4 = *(undefined8 *)(local_38 + 0x20);
  uVar5 = *(undefined8 *)(local_38 + 0x28);
  *(undefined8 *)(puVar9 + 0x10) = *(undefined8 *)local_38;
  *(undefined8 *)(puVar9 + 0x18) = uVar1;
  *(undefined8 *)(puVar9 + 0x20) = uVar2;
  *(undefined8 *)(puVar9 + 0x28) = uVar3;
  *(undefined8 *)(puVar9 + 0x30) = uVar4;
  *(undefined8 *)(puVar9 + 0x38) = uVar5;
  local_38 = local_38 + 0x30;
  uVar6 = read_8(&local_38);
  puVar9[0x40] = uVar6;
  uVar6 = read_8(&local_38);
  puVar9[0x41] = uVar6;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 0x42) = uVar7;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 0x44) = uVar7;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 0x46) = uVar7;
  uVar7 = read_le16(&local_38);
  *(uint16_t *)(puVar9 + 0x48) = uVar7;
  uVar1 = *(undefined8 *)(local_38 + 8);
  uVar2 = *(undefined8 *)(local_38 + 0x10);
  uVar3 = *(undefined8 *)(local_38 + 0x18);
  uVar4 = *(undefined8 *)(local_38 + 0x20);
  uVar5 = *(undefined8 *)(local_38 + 0x28);
  *(undefined8 *)(puVar9 + 0x4a) = *(undefined8 *)local_38;
  *(undefined8 *)(puVar9 + 0x52) = uVar1;
  *(undefined8 *)(puVar9 + 0x5a) = uVar2;
  *(undefined8 *)(puVar9 + 0x62) = uVar3;
  *(undefined8 *)(puVar9 + 0x6a) = uVar4;
  *(undefined8 *)(puVar9 + 0x72) = uVar5;
  *(undefined8 *)(puVar9 + 0x78) = *(undefined8 *)(local_38 + 0x2e);
  sVar12 = sptr_advance(data,0x80);
  uVar10 = sVar12.size;
  piVar8->type = '\x04';
  piVar8->header = puVar9;
  bVar11 = true;
  if (0x300 < uVar10) {
    bVar11 = puVar9[3] != '\b';
  }
  piVar8->width = (uint)*(ushort *)(puVar9 + 8) - (uint)*(ushort *)(puVar9 + 4);
  piVar8->height = (uint)*(ushort *)(puVar9 + 10) - (uint)*(ushort *)(puVar9 + 6);
  size = uVar10 - 0x300;
  if (bVar11) {
    size = uVar10;
  }
  sVar13 = sptr_xmalloc(size);
  piVar8->pixels = sVar13;
  memcpy(sVar13.ptr,sVar12.ptr,sVar13.size);
  sVar12 = sptr_advance(sVar12,(piVar8->pixels).size);
  if (bVar11) {
    (piVar8->palette).data.ptr = (uchar *)0x0;
    (piVar8->palette).data.size = 0;
    (piVar8->palette).type = '\0';
  }
  else {
    sVar13 = sptr_xmalloc(0x300);
    (piVar8->palette).data = sVar13;
    (piVar8->palette).type = '\x01';
    memcpy(sVar13.ptr,sVar12.ptr,0x300);
  }
  return piVar8;
}

Assistant:

struct image_data *pcx_read(const sptr_t data)
{
	unsigned char has_palette = 0;
	struct image_data *im = xmalloc(sizeof(struct image_data));
	struct pcx_header *header = read_header(data);
	sptr_t content = sptr_advance(data, PCX_HEADER_SIZE);
	im->type = IMAGE_TYPE_PCX;
	im->header = header;
	if (content.size > 768) {
		has_palette = header->bpp == 8;
	}
	im->width = header->xmax - header->xmin;
	im->height = header->ymax - header->ymin;
	im->pixels = has_palette ? sptr_xmalloc(content.size - PCX_PALETTE_SIZE)
							 : sptr_xmalloc(content.size);
	memcpy(im->pixels.ptr, content.ptr, im->pixels.size);
	content = sptr_advance(content, im->pixels.size);
	if (has_palette) {
		im->palette = (struct image_palette){sptr_xmalloc(PCX_PALETTE_SIZE),
											 PALETTE_TYPE_RGB_256};
		memcpy(im->palette.data.ptr, content.ptr, PCX_PALETTE_SIZE);
	} else {
		im->palette = (struct image_palette){SPTR_NULL, PALETTE_TYPE_NONE};
	}
	return im;
}